

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O2

int __thiscall
spdlog::async_logger::clone
          (async_logger *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Alloc_hider _Var1;
  shared_ptr<spdlog::async_logger> cloned;
  _func_int **local_28;
  _Alloc_hider _Stack_20;
  
  std::make_shared<spdlog::async_logger,spdlog::async_logger&>
            ((async_logger *)&stack0xffffffffffffffd8);
  std::__cxx11::string::operator=((string *)(local_28 + 1),(string *)__child_stack);
  _Var1._M_p = _Stack_20._M_p;
  _Stack_20._M_p = (pointer)0x0;
  (this->super_logger)._vptr_logger = local_28;
  (this->super_logger).name_._M_dataplus._M_p = _Var1._M_p;
  local_28 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<spdlog::logger> spdlog::async_logger::clone(std::string new_name)
{
    auto cloned = std::make_shared<spdlog::async_logger>(*this);
    cloned->name_ = std::move(new_name);
    return cloned;
}